

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::DoKeySetup(FGameConfigFile *this,char *gamename)

{
  FKeyBindings *this_00;
  bool bVar1;
  int iVar2;
  FKeyBindings *bindings;
  char *pcStack_28;
  int i;
  char *value;
  char *key;
  char *gamename_local;
  FGameConfigFile *this_local;
  
  key = gamename;
  gamename_local = (char *)this;
  iVar2 = mysnprintf(this->section,0x40,"%s.",gamename);
  this->sublen = 0x3f - (long)iVar2;
  this->subsection = (char *)((long)this + (0x78 - this->sublen));
  this->section[0x3f] = '\0';
  C_SetDefaultBindings();
  bindings._4_4_ = 0;
  while (DoKeySetup::binders[bindings._4_4_].label != (char *)0x0) {
    strncpy(this->subsection,DoKeySetup::binders[bindings._4_4_].label,this->sublen);
    bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
    if (bVar1) {
      this_00 = DoKeySetup::binders[bindings._4_4_].bindings;
      FKeyBindings::UnbindAll(this_00);
      while (bVar1 = FConfigFile::NextInSection
                               (&this->super_FConfigFile,&value,&stack0xffffffffffffffd8), bVar1) {
        FKeyBindings::DoBind(this_00,value,pcStack_28);
      }
    }
    bindings._4_4_ = bindings._4_4_ + 1;
  }
  return;
}

Assistant:

void FGameConfigFile::DoKeySetup(const char *gamename)
{
	static const struct { const char *label; FKeyBindings *bindings; } binders[] =
	{
		{ "Bindings", &Bindings },
		{ "DoubleBindings", &DoubleBindings },
		{ "AutomapBindings", &AutomapBindings },
		{ NULL, NULL }
	};
	const char *key, *value;

	sublen = countof(section) - 1 - mysnprintf(section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - sublen - 1;
	section[countof(section) - 1] = '\0';

	C_SetDefaultBindings ();

	for (int i = 0; binders[i].label != NULL; ++i)
	{
		strncpy(subsection, binders[i].label, sublen);
		if (SetSection(section))
		{
			FKeyBindings *bindings = binders[i].bindings;
			bindings->UnbindAll();
			while (NextInSection(key, value))
			{
				bindings->DoBind(key, value);
			}
		}
	}
}